

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O2

void __thiscall QPngHandler::setOption(QPngHandler *this,ImageOption option,QVariant *value)

{
  QPngHandlerPrivate *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  int iVar5;
  long in_FS_OFFSET;
  float fVar6;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(option) {
  case Description:
    ::QVariant::toString();
    pQVar1 = this->d;
    pDVar3 = (pQVar1->description).d.d;
    pcVar4 = (pQVar1->description).d.ptr;
    (pQVar1->description).d.d = local_38.d;
    (pQVar1->description).d.ptr = local_38.ptr;
    qVar2 = (pQVar1->description).d.size;
    (pQVar1->description).d.size = local_38.size;
    local_38.d = pDVar3;
    local_38.ptr = pcVar4;
    local_38.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    break;
  case CompressionRatio:
    iVar5 = ::QVariant::toInt((bool *)value);
    this->d->compression = iVar5;
    break;
  case Gamma:
    fVar6 = (float)::QVariant::toFloat((bool *)value);
    this->d->gamma = fVar6;
    break;
  case Quality:
    iVar5 = ::QVariant::toInt((bool *)value);
    this->d->quality = iVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPngHandler::setOption(ImageOption option, const QVariant &value)
{
    if (option == Gamma)
        d->gamma = value.toFloat();
    else if (option == Quality)
        d->quality = value.toInt();
    else if (option == CompressionRatio)
        d->compression = value.toInt();
    else if (option == Description)
        d->description = value.toString();
}